

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.hh
# Opt level: O0

void __thiscall OpenMesh::PolyConnectivity::~PolyConnectivity(PolyConnectivity *this)

{
  PolyConnectivity *this_local;
  
  (this->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel =
       (_func_int **)&PTR__PolyConnectivity_003dd0e8;
  std::
  vector<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>,_std::allocator<std::pair<OpenMesh::HalfedgeHandle,_OpenMesh::HalfedgeHandle>_>_>
  ::~vector(&this->next_cache_);
  std::
  vector<OpenMesh::PolyConnectivity::AddFaceEdgeInfo,_std::allocator<OpenMesh::PolyConnectivity::AddFaceEdgeInfo>_>
  ::~vector(&this->edgeData_);
  ArrayKernel::~ArrayKernel(&this->super_ArrayKernel);
  return;
}

Assistant:

virtual ~PolyConnectivity() {}